

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetReference<unsigned_int>
          (BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,uint *key,IndexPropertyDescriptor **value,int *index)

{
  int *piVar1;
  uint uVar2;
  SimpleDictionaryEntry<unsigned_int,_Js::IndexPropertyDescriptor> *pSVar3;
  uint uVar4;
  
  piVar1 = (this->buckets).ptr;
  uVar2 = 0;
  if (piVar1 != (int *)0x0) {
    uVar2 = GetBucket(*key * 2 + 1,this->bucketCount,this->modFunctionIndex);
    uVar4 = piVar1[uVar2];
    uVar2 = 0;
    if (-1 < (int)uVar4) {
      pSVar3 = (this->entries).ptr;
      uVar2 = 0;
      do {
        if (pSVar3[uVar4].
            super_DefaultHashedEntry<unsigned_int,_Js::IndexPropertyDescriptor,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_int,_Js::IndexPropertyDescriptor>.
            super_ValueEntry<Js::IndexPropertyDescriptor,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::IndexPropertyDescriptor>_>
            .super_KeyValueEntryDataLayout2<unsigned_int,_Js::IndexPropertyDescriptor>.key == *key)
        {
          if (this->stats != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(this->stats,uVar2);
            pSVar3 = (this->entries).ptr;
          }
          *value = (IndexPropertyDescriptor *)(pSVar3 + uVar4);
          *index = uVar4;
          return true;
        }
        uVar2 = uVar2 + 1;
        uVar4 = pSVar3[uVar4].
                super_DefaultHashedEntry<unsigned_int,_Js::IndexPropertyDescriptor,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<unsigned_int,_Js::IndexPropertyDescriptor>.
                super_ValueEntry<Js::IndexPropertyDescriptor,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::IndexPropertyDescriptor>_>
                .super_KeyValueEntryDataLayout2<unsigned_int,_Js::IndexPropertyDescriptor>.next;
      } while (-1 < (int)uVar4);
    }
  }
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,uVar2);
  }
  return false;
}

Assistant:

bool TryGetReference(const TLookup& key, TValue** value, int* index) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = &entries[i].Value();
                *index = i;
                return true;
            }
            return false;
        }